

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl.h
# Opt level: O0

void __thiscall flatbuffers::EnumVal::EnumVal(EnumVal *this,string *_name,int64_t _val)

{
  int64_t _val_local;
  string *_name_local;
  EnumVal *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)_name);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->doc_comment);
  Type::Type(&this->union_type,BASE_TYPE_NONE,(StructDef *)0x0,(EnumDef *)0x0,0);
  SymbolTable<flatbuffers::Value>::SymbolTable(&this->attributes);
  this->value = _val;
  return;
}

Assistant:

EnumVal(const std::string &_name, int64_t _val) : name(_name), value(_val) {}